

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O2

pair<QArrayData_*,_void_*>
QArrayData::reallocateUnaligned
          (QArrayData *data,void *dataPointer,qsizetype objectSize,qsizetype capacity,
          AllocationOption option)

{
  QArrayData *pQVar1;
  long lVar2;
  void *pvVar3;
  CalculateGrowingBlockSizeResult CVar4;
  pair<QArrayData_*,_void_*> pVar5;
  
  CVar4 = calculateBlockSize(capacity,objectSize,0x10,option);
  if (-1 < CVar4.size) {
    pQVar1 = (QArrayData *)realloc(data,CVar4.size);
    if (pQVar1 != (QArrayData *)0x0) {
      lVar2 = (long)dataPointer - (long)data;
      if (dataPointer == (void *)0x0) {
        lVar2 = 0x10;
      }
      pQVar1->alloc = CVar4.elementCount;
      pvVar3 = (void *)((long)&(pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + lVar2);
      goto LAB_00123c9b;
    }
  }
  pvVar3 = (void *)0x0;
  pQVar1 = (QArrayData *)0x0;
LAB_00123c9b:
  pVar5.second = pvVar3;
  pVar5.first = pQVar1;
  return pVar5;
}

Assistant:

std::pair<QArrayData *, void *>
QArrayData::reallocateUnaligned(QArrayData *data, void *dataPointer,
                                qsizetype objectSize, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(!data || !data->isShared());

    const qsizetype headerSize = sizeof(AlignedQArrayData);
    auto r = calculateBlockSize(capacity, objectSize, headerSize, option);
    qsizetype allocSize = r.size;
    capacity = r.elementCount;
    if (Q_UNLIKELY(allocSize < 0))
        return {};

    const qptrdiff offset = dataPointer
            ? reinterpret_cast<char *>(dataPointer) - reinterpret_cast<char *>(data)
            : headerSize;
    Q_ASSERT(offset > 0);
    Q_ASSERT(offset <= allocSize); // equals when all free space is at the beginning

    QArrayData *header = static_cast<QArrayData *>(::realloc(data, size_t(allocSize)));
    if (header) {
        header->alloc = capacity;
        dataPointer = reinterpret_cast<char *>(header) + offset;
    } else {
        dataPointer = nullptr;
    }
    return {header, dataPointer};
}